

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_info.cc
# Opt level: O0

int main(int argc,char **argv)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  size_type sVar7;
  void *pvVar8;
  string *psVar9;
  uint64_t uVar10;
  element_type *this;
  ostream *poVar11;
  long lVar12;
  int __oflag;
  int __oflag_00;
  int __oflag_01;
  int __oflag_02;
  int __oflag_03;
  int __oflag_04;
  undefined8 *in_RSI;
  char *pcVar13;
  char *pcVar14;
  int in_EDI;
  exception *ex;
  size_t i_3;
  vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_> stream;
  int64_t eventid;
  string key;
  string value;
  size_t j_3;
  string p;
  size_t i_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  shared_ptr<GenApi_3_4::CNodeMapRef> lnodemap;
  shared_ptr<GenApi_3_4::CNodeMapRef> nodemap;
  shared_ptr<rcg::Device> dev;
  size_t j_2;
  int depth;
  string node;
  string devid;
  bool edit;
  bool local_nodemap;
  char *paramfile;
  char *xml;
  int module_event_timeout;
  int k_2;
  size_t j_1;
  vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> device_1;
  size_t k_1;
  vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
  interf_1;
  size_t i_1;
  vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_> system_1;
  size_t j;
  vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> device;
  size_t k;
  vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_> interf;
  size_t i;
  vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_> system;
  bool extended;
  int ret;
  Interface *in_stack_fffffffffffff148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff160;
  Device *in_stack_fffffffffffff178;
  System *in_stack_fffffffffffff180;
  Device *in_stack_fffffffffffff198;
  Device *in_stack_fffffffffffff1a0;
  Device *in_stack_fffffffffffff1b0;
  Device *in_stack_fffffffffffff1d8;
  Interface *in_stack_fffffffffffff1e8;
  undefined4 in_stack_fffffffffffff1f0;
  undefined1 uVar15;
  int in_stack_fffffffffffff1f4;
  Device *in_stack_fffffffffffff1f8;
  shared_ptr<GenApi_3_4::CNodeMapRef> *in_stack_fffffffffffff200;
  Device *in_stack_fffffffffffff288;
  undefined8 in_stack_fffffffffffff310;
  undefined7 in_stack_fffffffffffff318;
  undefined1 in_stack_fffffffffffff31f;
  shared_ptr<GenApi_3_4::CNodeMapRef> *in_stack_fffffffffffff320;
  allocator *paVar16;
  ostream *in_stack_fffffffffffff3c0;
  ostream *in_stack_fffffffffffff3c8;
  undefined7 in_stack_fffffffffffff3e8;
  byte in_stack_fffffffffffff3ef;
  System *in_stack_fffffffffffff3f8;
  undefined7 in_stack_fffffffffffff400;
  byte in_stack_fffffffffffff407;
  Device *in_stack_fffffffffffff408;
  char *in_stack_fffffffffffff420;
  allocator *in_stack_fffffffffffff428;
  undefined7 in_stack_fffffffffffff430;
  byte in_stack_fffffffffffff437;
  shared_ptr<GenApi_3_4::CNodeMapRef> *in_stack_fffffffffffff438;
  char *in_stack_fffffffffffff450;
  undefined1 uVar17;
  allocator *in_stack_fffffffffffff458;
  undefined7 in_stack_fffffffffffff460;
  byte in_stack_fffffffffffff467;
  shared_ptr<GenApi_3_4::CNodeMapRef> *in_stack_fffffffffffff468;
  bool local_912;
  bool local_8e1;
  ulong local_8d8;
  vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_> local_8d0;
  string local_8b8 [32];
  string local_898 [32];
  string local_878 [32];
  string local_858 [32];
  string local_838 [32];
  string local_818 [32];
  string local_7f8 [32];
  int64_t local_7d8;
  string local_7d0 [32];
  string local_7b0 [32];
  undefined8 local_790;
  string local_788 [39];
  allocator local_761;
  string local_760 [32];
  ulong local_740;
  string local_738 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_718;
  char local_6f0 [16];
  char local_6e0 [16];
  char local_6d0 [16];
  __shared_ptr local_6c0 [16];
  __shared_ptr local_6b0 [16];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  long local_620;
  int local_618;
  allocator local_611;
  string local_610 [39];
  allocator local_5e9;
  string local_5e8 [39];
  allocator local_5c1;
  string local_5c0 [39];
  allocator local_599;
  string local_598 [39];
  allocator local_571;
  string local_570 [39];
  allocator local_549;
  string local_548 [39];
  allocator local_521;
  string local_520 [39];
  allocator local_4f9;
  string local_4f8 [39];
  allocator local_4d1;
  string local_4d0 [38];
  byte local_4aa;
  byte local_4a9;
  long local_4a8;
  char *local_4a0;
  int local_498;
  int local_494;
  string local_490 [32];
  string local_470 [15];
  undefined1 in_stack_fffffffffffffb9f;
  char *in_stack_fffffffffffffba0;
  char *in_stack_fffffffffffffba8;
  shared_ptr<GenApi_3_4::CNodeMapRef> *in_stack_fffffffffffffbb0;
  string local_430 [32];
  ulong local_410;
  vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> local_408;
  char *local_3f0;
  vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
  local_3e8;
  char *local_3d0;
  vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_> local_3c8;
  allocator local_3a9;
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  ulong local_288;
  vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_> local_270;
  string local_258 [32];
  string local_238 [32];
  char *local_218;
  vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
  local_200;
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  char *local_e8;
  vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_> local_e0;
  allocator local_c1;
  string local_c0 [36];
  byte local_9c;
  byte local_9b;
  byte local_9a;
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [35];
  byte local_4d;
  byte local_3a;
  allocator local_39;
  string local_38 [36];
  int local_14;
  undefined8 *local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_14 = 0;
  local_3a = 0;
  local_4d = 0;
  local_8e1 = false;
  local_10 = in_RSI;
  local_8 = in_EDI;
  if (1 < in_EDI) {
    pcVar13 = (char *)in_RSI[1];
    std::allocator<char>::allocator();
    local_3a = 1;
    std::__cxx11::string::string(local_38,pcVar13,&local_39);
    local_4d = 1;
    local_8e1 = std::operator!=(in_stack_fffffffffffff150,(char *)in_stack_fffffffffffff148);
  }
  if ((local_4d & 1) != 0) {
    std::__cxx11::string::~string(local_38);
  }
  if ((local_3a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  if (local_8e1 == false) {
    poVar11 = std::operator<<((ostream *)&std::cout,(char *)*local_10);
    poVar11 = std::operator<<(poVar11,
                              " -h | -L | -l | -s | ([-o <xml-output-file>|.] [-m <timeout>] [-p <file>] [-d] [-e] [<interface-id>:]<device-id>[?<node>] [@<file>] [<key>=<value>] ...)"
                             );
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar11 = std::operator<<((ostream *)&std::cout,
                              "Provides information about GenICam transport layers, interfaces and devices."
                             );
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar11 = std::operator<<((ostream *)&std::cout,"Options: ");
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    poVar11 = std::operator<<((ostream *)&std::cout,"-h   Prints help information and exits");
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    poVar11 = std::operator<<((ostream *)&std::cout,
                              "-L   List all available devices on all interfaces (extended format)")
    ;
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    poVar11 = std::operator<<((ostream *)&std::cout,
                              "-l   List all available devices on all interfaces");
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    poVar11 = std::operator<<((ostream *)&std::cout,
                              "-s   List all available devices on all interfaces (short format)");
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    poVar11 = std::operator<<((ostream *)&std::cout,
                              "-o   Store XML description from specified device");
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    poVar11 = std::operator<<((ostream *)&std::cout,
                              "-m   Registers for module events and waits for the given number of seconds for such events"
                             );
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    poVar11 = std::operator<<((ostream *)&std::cout,
                              "-d   Use local device nodemap, instead of remote nodemap");
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    poVar11 = std::operator<<((ostream *)&std::cout,
                              "-e   Open nodemap editor instead of printing nodemap");
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    poVar11 = std::operator<<((ostream *)&std::cout,
                              "-p   Store all streamable parameters to the given file, after applying all parameters"
                             );
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar11 = std::operator<<((ostream *)&std::cout,"Parameters:");
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    poVar11 = std::operator<<((ostream *)&std::cout,
                              "<interface-id> Optional GenICam ID of interface for connecting to the device"
                             );
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    poVar11 = std::operator<<((ostream *)&std::cout,
                              "<device-id>    GenICam device ID, serial number or user defined name of device"
                             );
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    poVar11 = std::operator<<((ostream *)&std::cout,
                              "<node>         Optional name of category or parameter to be reported. \'-\' for none. Default is \'Root\'."
                             );
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    poVar11 = std::operator<<((ostream *)&std::cout,
                              "@<file>        Optional file with parameters as store with parameter \'-p\'"
                             );
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    poVar11 = std::operator<<((ostream *)&std::cout,
                              "<key>=<value>  Optional GenICam parameters to be changed in the given order before reporting"
                             );
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    local_14 = 1;
  }
  else {
    pcVar13 = (char *)local_10[1];
    std::allocator<char>::allocator();
    local_9a = 0;
    local_9b = 0;
    std::__cxx11::string::string(local_70,pcVar13,&local_71);
    bVar2 = std::operator==(in_stack_fffffffffffff150,(char *)in_stack_fffffffffffff148);
    local_912 = true;
    if (!bVar2) {
      pcVar13 = (char *)local_10[1];
      std::allocator<char>::allocator();
      local_9a = 1;
      std::__cxx11::string::string(local_98,pcVar13,&local_99);
      local_9b = 1;
      local_912 = std::operator==(in_stack_fffffffffffff150,(char *)in_stack_fffffffffffff148);
    }
    if ((local_9b & 1) != 0) {
      std::__cxx11::string::~string(local_98);
    }
    if ((local_9a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
    }
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    if (local_912 == false) {
      pcVar13 = (char *)local_10[1];
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3a8,pcVar13,&local_3a9);
      bVar2 = std::operator==(in_stack_fffffffffffff150,(char *)in_stack_fffffffffffff148);
      std::__cxx11::string::~string(local_3a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
      if (!bVar2) {
        local_494 = 1;
        local_498 = -1;
        local_4a0 = (char *)0x0;
        local_4a8 = 0;
        local_4a9 = 0;
        local_4aa = 0;
LAB_0010afd6:
        while( true ) {
          while( true ) {
            while( true ) {
              uVar17 = (undefined1)((ulong)in_stack_fffffffffffff450 >> 0x38);
              bVar2 = false;
              if (local_494 + 1 < local_8) {
                bVar2 = *(char *)local_10[local_494] == '-';
              }
              if (!bVar2) goto LAB_0010b798;
              in_stack_fffffffffffff468 = (shared_ptr<GenApi_3_4::CNodeMapRef> *)local_10[local_494]
              ;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_4d0,(char *)in_stack_fffffffffffff468,&local_4d1);
              in_stack_fffffffffffff467 =
                   std::operator==(in_stack_fffffffffffff150,(char *)in_stack_fffffffffffff148);
              std::__cxx11::string::~string(local_4d0);
              std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
              if ((in_stack_fffffffffffff467 & 1) == 0) break;
              iVar3 = local_494 + 1;
              local_494 = local_494 + 2;
              in_stack_fffffffffffff450 = (char *)local_10[iVar3];
              in_stack_fffffffffffff458 = &local_4f9;
              local_4a0 = in_stack_fffffffffffff450;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_4f8,in_stack_fffffffffffff450,in_stack_fffffffffffff458);
              bVar2 = std::operator==(in_stack_fffffffffffff150,(char *)in_stack_fffffffffffff148);
              std::__cxx11::string::~string(local_4f8);
              std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
              if (bVar2) {
                local_4a0 = "";
              }
            }
            in_stack_fffffffffffff438 = (shared_ptr<GenApi_3_4::CNodeMapRef> *)local_10[local_494];
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_520,(char *)in_stack_fffffffffffff438,&local_521);
            in_stack_fffffffffffff437 =
                 std::operator==(in_stack_fffffffffffff150,(char *)in_stack_fffffffffffff148);
            std::__cxx11::string::~string(local_520);
            std::allocator<char>::~allocator((allocator<char> *)&local_521);
            if ((in_stack_fffffffffffff437 & 1) == 0) break;
            iVar3 = local_494 + 1;
            local_494 = local_494 + 2;
            in_stack_fffffffffffff420 = (char *)local_10[iVar3];
            in_stack_fffffffffffff428 = &local_549;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_548,in_stack_fffffffffffff420,in_stack_fffffffffffff428);
            local_498 = std::__cxx11::stoi(in_stack_fffffffffffff150,
                                           (size_t *)in_stack_fffffffffffff148,0);
            std::__cxx11::string::~string(local_548);
            std::allocator<char>::~allocator((allocator<char> *)&local_549);
          }
          in_stack_fffffffffffff408 = (Device *)local_10[local_494];
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_570,(char *)in_stack_fffffffffffff408,&local_571);
          in_stack_fffffffffffff407 =
               std::operator==(in_stack_fffffffffffff150,(char *)in_stack_fffffffffffff148);
          std::__cxx11::string::~string(local_570);
          std::allocator<char>::~allocator((allocator<char> *)&local_571);
          if ((in_stack_fffffffffffff407 & 1) == 0) break;
          iVar3 = local_494 + 1;
          local_494 = local_494 + 2;
          local_4a8 = local_10[iVar3];
        }
        pcVar13 = (char *)local_10[local_494];
        paVar16 = &local_599;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_598,pcVar13,paVar16);
        in_stack_fffffffffffff3ef =
             std::operator==(in_stack_fffffffffffff150,(char *)in_stack_fffffffffffff148);
        std::__cxx11::string::~string(local_598);
        std::allocator<char>::~allocator((allocator<char> *)&local_599);
        if ((in_stack_fffffffffffff3ef & 1) == 0) {
          pcVar13 = (char *)local_10[local_494];
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_5c0,pcVar13,&local_5c1);
          bVar2 = std::operator==(in_stack_fffffffffffff150,(char *)in_stack_fffffffffffff148);
          std::__cxx11::string::~string(local_5c0);
          std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
          uVar17 = (undefined1)((ulong)in_stack_fffffffffffff450 >> 0x38);
          if (!bVar2) {
            in_stack_fffffffffffff3c8 = std::operator<<((ostream *)&std::cerr,"Unknown parameter: ")
            ;
            in_stack_fffffffffffff3c0 =
                 std::operator<<(in_stack_fffffffffffff3c8,(char *)local_10[local_494]);
            std::ostream::operator<<
                      (in_stack_fffffffffffff3c0,std::endl<char,std::char_traits<char>>);
            local_14 = 1;
LAB_0010b798:
            if (local_14 == 0) {
              if (local_494 < local_8) {
                lVar12 = (long)local_494;
                local_494 = local_494 + 1;
                pcVar13 = (char *)local_10[lVar12];
                paVar16 = &local_5e9;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_5e8,pcVar13,paVar16);
                std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_610,"Root",&local_611);
                std::allocator<char>::~allocator((allocator<char> *)&local_611);
                local_618 = 1000;
                local_620 = std::__cxx11::string::find((char)local_5e8,0x3f);
                if (local_620 != -1) {
                  std::__cxx11::string::substr((ulong)local_640,(ulong)local_5e8);
                  bVar2 = std::operator!=(in_stack_fffffffffffff150,
                                          (char *)in_stack_fffffffffffff148);
                  std::__cxx11::string::~string(local_640);
                  if (bVar2) {
                    std::__cxx11::string::substr((ulong)local_660,(ulong)local_5e8);
                    std::__cxx11::string::operator=(local_610,local_660);
                    std::__cxx11::string::~string(local_660);
                    std::__cxx11::string::substr((ulong)local_680,(ulong)local_5e8);
                    std::__cxx11::string::operator=(local_5e8,local_680);
                    std::__cxx11::string::~string(local_680);
                    local_618 = 1;
                    lVar12 = std::__cxx11::string::size();
                    if (lVar12 == 0) {
                      std::__cxx11::string::operator=(local_610,"Root");
                    }
                  }
                  else {
                    std::__cxx11::string::operator=(local_610,"");
                    std::__cxx11::string::substr((ulong)local_6a0,(ulong)local_5e8);
                    std::__cxx11::string::operator=(local_5e8,local_6a0);
                    std::__cxx11::string::~string(local_6a0);
                  }
                }
                std::__cxx11::string::c_str();
                rcg::getDevice((char *)in_stack_fffffffffffff148);
                bVar2 = std::__shared_ptr::operator_cast_to_bool(local_6b0);
                if (bVar2) {
                  if (((local_494 < local_8) || ((local_4aa & 1) != 0)) || (local_4a8 != 0)) {
                    peVar6 = std::
                             __shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)0x10bb23);
                    rcg::Device::open(peVar6,(char *)0x1,__oflag_03);
                  }
                  else {
                    peVar6 = std::
                             __shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)0x10bb5a);
                    rcg::Device::open(peVar6,(char *)0x0,__oflag_04);
                  }
                  std::shared_ptr<GenApi_3_4::CNodeMapRef>::shared_ptr
                            ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x10bb75);
                  if ((local_4a9 & 1) == 0) {
                    std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x10bbf0);
                    rcg::Device::getRemoteNodeMap
                              (in_stack_fffffffffffff1f8,
                               (char *)CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0)
                              );
                    pcVar14 = local_6e0;
                    std::shared_ptr<GenApi_3_4::CNodeMapRef>::operator=
                              ((shared_ptr<GenApi_3_4::CNodeMapRef> *)in_stack_fffffffffffff150,
                               (shared_ptr<GenApi_3_4::CNodeMapRef> *)in_stack_fffffffffffff148);
                    std::shared_ptr<GenApi_3_4::CNodeMapRef>::~shared_ptr
                              ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x10bc2c);
                  }
                  else {
                    std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x10bb8c);
                    rcg::Device::getNodeMap
                              (in_stack_fffffffffffff1f8,
                               (char *)CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0)
                              );
                    pcVar14 = local_6d0;
                    std::shared_ptr<GenApi_3_4::CNodeMapRef>::operator=
                              ((shared_ptr<GenApi_3_4::CNodeMapRef> *)in_stack_fffffffffffff150,
                               (shared_ptr<GenApi_3_4::CNodeMapRef> *)in_stack_fffffffffffff148);
                    std::shared_ptr<GenApi_3_4::CNodeMapRef>::~shared_ptr
                              ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x10bbc8);
                  }
                  if (-1 < local_498) {
                    std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x10bc47);
                    rcg::Device::enableModuleEvents(in_stack_fffffffffffff1a0);
                    std::shared_ptr<GenApi_3_4::CNodeMapRef>::shared_ptr
                              ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x10bc5e);
                    std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x10bc6b);
                    rcg::Device::getNodeMap
                              (in_stack_fffffffffffff1f8,
                               (char *)CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0)
                              );
                    pcVar14 = local_6f0;
                    std::shared_ptr<GenApi_3_4::CNodeMapRef>::operator=
                              ((shared_ptr<GenApi_3_4::CNodeMapRef> *)in_stack_fffffffffffff150,
                               (shared_ptr<GenApi_3_4::CNodeMapRef> *)in_stack_fffffffffffff148);
                    std::shared_ptr<GenApi_3_4::CNodeMapRef>::~shared_ptr
                              ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x10bcb3);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)0x10bcc8);
                    rcg::getEnum(in_stack_fffffffffffff468,
                                 (char *)CONCAT17(in_stack_fffffffffffff467,
                                                  in_stack_fffffffffffff460),
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)in_stack_fffffffffffff458,(bool)uVar17);
                    std::__cxx11::string::~string(local_738);
                    for (local_740 = 0; uVar1 = local_740,
                        sVar7 = std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::size(&local_718), uVar1 < sVar7; local_740 = local_740 + 1) {
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](&local_718,local_740);
                      std::__cxx11::string::c_str();
                      rcg::setEnum(in_stack_fffffffffffff438,
                                   (char *)CONCAT17(in_stack_fffffffffffff437,
                                                    in_stack_fffffffffffff430),
                                   (char *)in_stack_fffffffffffff428,
                                   SUB81((ulong)in_stack_fffffffffffff420 >> 0x38,0));
                      pcVar14 = "EventNotification";
                      rcg::setEnum(in_stack_fffffffffffff438,
                                   (char *)CONCAT17(in_stack_fffffffffffff437,
                                                    in_stack_fffffffffffff430),
                                   (char *)in_stack_fffffffffffff428,
                                   SUB81((ulong)in_stack_fffffffffffff420 >> 0x38,0));
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(in_stack_fffffffffffff160);
                    std::shared_ptr<GenApi_3_4::CNodeMapRef>::~shared_ptr
                              ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x10be03);
                  }
                  bVar2 = std::__shared_ptr::operator_cast_to_bool(local_6c0);
                  if (bVar2) {
                    while (iVar3 = (int)pcVar14, local_494 < local_8) {
                      lVar12 = (long)local_494;
                      local_494 = local_494 + 1;
                      pcVar14 = (char *)local_10[lVar12];
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_760,pcVar14,&local_761);
                      std::allocator<char>::~allocator((allocator<char> *)&local_761);
                      lVar12 = std::__cxx11::string::size();
                      if ((lVar12 == 0) ||
                         (pcVar14 = (char *)std::__cxx11::string::operator[]((ulong)local_760),
                         *pcVar14 != '@')) {
                        lVar12 = std::__cxx11::string::find((char)local_760,0x3d);
                        if (lVar12 == -1) {
                          pcVar14 = (char *)std::__cxx11::string::c_str();
                          rcg::callCommand(in_stack_fffffffffffff320,
                                           (char *)CONCAT17(in_stack_fffffffffffff31f,
                                                            in_stack_fffffffffffff318),
                                           SUB81((ulong)in_stack_fffffffffffff310 >> 0x38,0));
                        }
                        else {
                          local_790 = std::__cxx11::string::find((char)local_760,0x3d);
                          std::__cxx11::string::substr((ulong)local_7b0,(ulong)local_760);
                          std::__cxx11::string::substr((ulong)local_7d0,(ulong)local_760);
                          pcVar14 = (char *)std::__cxx11::string::c_str();
                          std::__cxx11::string::c_str();
                          rcg::setString(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                                         in_stack_fffffffffffffba0,(bool)in_stack_fffffffffffffb9f);
                          std::__cxx11::string::~string(local_7d0);
                          std::__cxx11::string::~string(local_7b0);
                        }
                      }
                      else {
                        std::__cxx11::string::substr((ulong)local_788,(ulong)local_760);
                        pcVar14 = (char *)std::__cxx11::string::c_str();
                        rcg::loadStreamableParameters
                                  ((shared_ptr<GenApi_3_4::CNodeMapRef> *)in_stack_fffffffffffff3c0,
                                   (char *)paVar16,SUB81((ulong)pcVar13 >> 0x38,0));
                        std::__cxx11::string::~string(local_788);
                      }
                      std::__cxx11::string::~string(local_760);
                    }
                    if (-1 < local_498) {
                      poVar11 = std::operator<<((ostream *)&std::cout,"Waiting for events");
                      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
                      std::
                      __shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x10c17e);
                      local_7d8 = rcg::Device::getModuleEvent
                                            (in_stack_fffffffffffff408,
                                             CONCAT17(in_stack_fffffffffffff407,
                                                      in_stack_fffffffffffff400));
                      if (local_7d8 < 0) {
                        poVar11 = std::operator<<((ostream *)&std::cout,"Received no module events")
                        ;
                        std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
                      }
                      while (-1 < local_7d8) {
                        poVar11 = std::operator<<((ostream *)&std::cout,
                                                  "Received module event with ID: ");
                        pvVar8 = (void *)std::ostream::operator<<(poVar11,local_7d8);
                        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
                        std::
                        __shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                        operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x10c260);
                        local_7d8 = rcg::Device::getModuleEvent
                                              (in_stack_fffffffffffff408,
                                               CONCAT17(in_stack_fffffffffffff407,
                                                        in_stack_fffffffffffff400));
                      }
                      iVar3 = 0x156198;
                      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
                    }
                    uVar17 = (undefined1)((ulong)pcVar13 >> 0x38);
                    if ((local_4aa & 1) == 0) {
                      lVar12 = std::__cxx11::string::size();
                      uVar17 = (undefined1)((ulong)pcVar13 >> 0x38);
                      uVar15 = (undefined1)((uint)in_stack_fffffffffffff1f0 >> 0x18);
                      if (lVar12 != 0) {
                        if (local_618 < 2) {
                          iVar3 = std::__cxx11::string::c_str();
                          bVar2 = rcg::printNodemap(in_stack_fffffffffffff200,
                                                    (char *)in_stack_fffffffffffff1f8,
                                                    in_stack_fffffffffffff1f4,(bool)uVar15);
                          if (!bVar2) {
                            poVar11 = std::operator<<((ostream *)&std::cerr,"Unknown node: ");
                            poVar11 = std::operator<<(poVar11,local_610);
                            iVar3 = 0x156198;
                            std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>)
                            ;
                            local_14 = 1;
                          }
                        }
                        else {
                          poVar11 = std::operator<<((ostream *)&std::cout,"Device:            ");
                          peVar6 = std::
                                   __shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   ::operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                 *)0x10c394);
                          psVar9 = rcg::Device::getID_abi_cxx11_(peVar6);
                          poVar11 = std::operator<<(poVar11,(string *)psVar9);
                          std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
                          poVar11 = std::operator<<((ostream *)&std::cout,"Vendor:            ");
                          std::
                          __shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x10c405);
                          rcg::Device::getVendor_abi_cxx11_(in_stack_fffffffffffff178);
                          poVar11 = std::operator<<(poVar11,local_7f8);
                          std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
                          std::__cxx11::string::~string(local_7f8);
                          poVar11 = std::operator<<((ostream *)&std::cout,"Model:             ");
                          std::
                          __shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x10c483);
                          rcg::Device::getModel_abi_cxx11_(in_stack_fffffffffffff178);
                          poVar11 = std::operator<<(poVar11,local_818);
                          std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
                          std::__cxx11::string::~string(local_818);
                          poVar11 = std::operator<<((ostream *)&std::cout,"TL type:           ");
                          std::
                          __shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x10c501);
                          rcg::Device::getTLType_abi_cxx11_(in_stack_fffffffffffff178);
                          poVar11 = std::operator<<(poVar11,local_838);
                          std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
                          std::__cxx11::string::~string(local_838);
                          poVar11 = std::operator<<((ostream *)&std::cout,"Display name:      ");
                          std::
                          __shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x10c57f);
                          rcg::Device::getDisplayName_abi_cxx11_(in_stack_fffffffffffff198);
                          poVar11 = std::operator<<(poVar11,local_858);
                          std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
                          std::__cxx11::string::~string(local_858);
                          poVar11 = std::operator<<((ostream *)&std::cout,"User defined name: ");
                          std::
                          __shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x10c5fd);
                          rcg::Device::getUserDefinedName_abi_cxx11_(in_stack_fffffffffffff288);
                          poVar11 = std::operator<<(poVar11,local_878);
                          std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
                          std::__cxx11::string::~string(local_878);
                          poVar11 = std::operator<<((ostream *)&std::cout,"Serial number:     ");
                          std::
                          __shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x10c67b);
                          rcg::Device::getSerialNumber_abi_cxx11_(in_stack_fffffffffffff178);
                          poVar11 = std::operator<<(poVar11,local_898);
                          std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
                          std::__cxx11::string::~string(local_898);
                          poVar11 = std::operator<<((ostream *)&std::cout,"Version:           ");
                          std::
                          __shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x10c6f9);
                          rcg::Device::getVersion_abi_cxx11_(in_stack_fffffffffffff178);
                          poVar11 = std::operator<<(poVar11,local_8b8);
                          std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
                          std::__cxx11::string::~string(local_8b8);
                          poVar11 = std::operator<<((ostream *)&std::cout,"TS Frequency:      ");
                          std::
                          __shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x10c777);
                          uVar10 = rcg::Device::getTimestampFrequency(in_stack_fffffffffffff1b0);
                          pvVar8 = (void *)std::ostream::operator<<(poVar11,uVar10);
                          std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
                          std::ostream::operator<<
                                    (&std::cout,std::endl<char,std::char_traits<char>>);
                          std::
                          __shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)0x10c7e0);
                          rcg::Device::getStreams
                                    ((Device *)
                                     CONCAT17(in_stack_fffffffffffff3ef,in_stack_fffffffffffff3e8));
                          poVar11 = std::operator<<((ostream *)&std::cout,"Available streams:");
                          std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
                          local_8d8 = 0;
                          while( true ) {
                            sVar7 = std::
                                    vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
                                    ::size(&local_8d0);
                            uVar17 = (undefined1)((ulong)pcVar13 >> 0x38);
                            uVar15 = (undefined1)((uint)in_stack_fffffffffffff1f0 >> 0x18);
                            if (sVar7 <= local_8d8) break;
                            poVar11 = std::operator<<((ostream *)&std::cout,"  Stream ID: ");
                            std::
                            vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
                            ::operator[](&local_8d0,local_8d8);
                            this = std::
                                   __shared_ptr_access<rcg::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   ::operator->((__shared_ptr_access<rcg::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                 *)0x10c89c);
                            psVar9 = rcg::Stream::getID_abi_cxx11_(this);
                            poVar11 = std::operator<<(poVar11,(string *)psVar9);
                            std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>)
                            ;
                            local_8d8 = local_8d8 + 1;
                          }
                          std::ostream::operator<<
                                    (&std::cout,std::endl<char,std::char_traits<char>>);
                          if ((local_4a9 & 1) == 0) {
                            poVar11 = std::operator<<((ostream *)&std::cout,"Remote device nodemap:"
                                                     );
                            std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>)
                            ;
                          }
                          else {
                            poVar11 = std::operator<<((ostream *)&std::cout,"Local device nodemap:")
                            ;
                            std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>)
                            ;
                          }
                          iVar3 = std::__cxx11::string::c_str();
                          rcg::printNodemap(in_stack_fffffffffffff200,
                                            (char *)in_stack_fffffffffffff1f8,
                                            in_stack_fffffffffffff1f4,(bool)uVar15);
                          std::
                          vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
                          ::~vector((vector<std::shared_ptr<rcg::Stream>,_std::allocator<std::shared_ptr<rcg::Stream>_>_>
                                     *)in_stack_fffffffffffff160);
                        }
                      }
                    }
                    else {
                      iVar3 = std::__cxx11::string::c_str();
                      bVar2 = rcg::editNodemap((shared_ptr<GenApi_3_4::CNodeMapRef> *)
                                               in_stack_fffffffffffff3c8,
                                               (char *)in_stack_fffffffffffff3c0);
                      if (!bVar2) {
                        poVar11 = std::operator<<((ostream *)&std::cerr,"Unknown node: ");
                        poVar11 = std::operator<<(poVar11,local_610);
                        iVar3 = 0x156198;
                        std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
                        local_14 = 1;
                      }
                    }
                    if (local_4a8 != 0) {
                      iVar3 = (int)local_4a8;
                      rcg::saveStreamableParameters
                                ((shared_ptr<GenApi_3_4::CNodeMapRef> *)in_stack_fffffffffffff3c0,
                                 (char *)paVar16,(bool)uVar17);
                    }
                  }
                  else {
                    poVar11 = std::operator<<((ostream *)&std::cerr,"Nodemap not available!");
                    iVar3 = 0x156198;
                    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
                  }
                  peVar6 = std::
                           __shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)0x10cc03);
                  rcg::Device::close(peVar6,iVar3);
                  std::shared_ptr<GenApi_3_4::CNodeMapRef>::~shared_ptr
                            ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x10cc1a);
                }
                else {
                  poVar11 = std::operator<<((ostream *)&std::cerr,"Device \'");
                  poVar11 = std::operator<<(poVar11,local_5e8);
                  poVar11 = std::operator<<(poVar11,"\' not found!");
                  std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
                  local_14 = 1;
                }
                std::shared_ptr<rcg::Device>::~shared_ptr((shared_ptr<rcg::Device> *)0x10ccb9);
                std::__cxx11::string::~string(local_610);
                std::__cxx11::string::~string(local_5e8);
              }
              else {
                poVar11 = std::operator<<((ostream *)&std::cerr,"Device name not given!");
                std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
                local_14 = 1;
              }
            }
            goto LAB_0010cd78;
          }
          local_4aa = 1;
        }
        else {
          local_4a9 = 1;
        }
        local_494 = local_494 + 1;
        goto LAB_0010afd6;
      }
      rcg::System::getSystems();
      poVar11 = std::operator<<((ostream *)&std::cout,
                                "Interface\tSerial Number\tVendor\tModel\tName");
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      for (local_3d0 = (char *)0x0; pcVar13 = local_3d0,
          pcVar14 = (char *)std::
                            vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                            ::size(&local_3c8), pcVar13 < pcVar14; local_3d0 = local_3d0 + 1) {
        pcVar13 = local_3d0;
        std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
        operator[](&local_3c8,(size_type)local_3d0);
        peVar4 = std::__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x10aa3b);
        rcg::System::open(peVar4,pcVar13,__oflag_01);
        std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
        operator[](&local_3c8,(size_type)local_3d0);
        std::__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x10aa62);
        rcg::System::getInterfaces(in_stack_fffffffffffff3f8);
        for (local_3f0 = (char *)0x0; pcVar13 = local_3f0,
            pcVar14 = (char *)std::
                              vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                              ::size(&local_3e8), pcVar13 < pcVar14; local_3f0 = local_3f0 + 1) {
          pcVar13 = local_3f0;
          std::
          vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
          ::operator[](&local_3e8,(size_type)local_3f0);
          peVar5 = std::
                   __shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x10aace);
          rcg::Interface::open(peVar5,pcVar13,__oflag_02);
          std::
          vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
          ::operator[](&local_3e8,(size_type)local_3f0);
          std::__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x10aaf5);
          rcg::Interface::getDevices(in_stack_fffffffffffff148);
          for (local_410 = 0; uVar1 = local_410,
              sVar7 = std::
                      vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                      ::size(&local_408), uVar1 < sVar7; local_410 = local_410 + 1) {
            std::
            vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
            ::operator[](&local_3e8,(size_type)local_3f0);
            peVar5 = std::
                     __shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x10ab61);
            psVar9 = rcg::Interface::getID_abi_cxx11_(peVar5);
            poVar11 = std::operator<<((ostream *)&std::cout,(string *)psVar9);
            poVar11 = std::operator<<(poVar11,'\t');
            std::
            vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
            operator[](&local_408,local_410);
            std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )0x10abca);
            rcg::Device::getSerialNumber_abi_cxx11_(in_stack_fffffffffffff178);
            poVar11 = std::operator<<(poVar11,local_430);
            poVar11 = std::operator<<(poVar11,'\t');
            std::
            vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
            operator[](&local_408,local_410);
            std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )0x10ac34);
            rcg::Device::getVendor_abi_cxx11_(in_stack_fffffffffffff178);
            poVar11 = std::operator<<(poVar11,(string *)&stack0xfffffffffffffbb0);
            poVar11 = std::operator<<(poVar11,'\t');
            std::
            vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
            operator[](&local_408,local_410);
            std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )0x10ac9e);
            rcg::Device::getModel_abi_cxx11_(in_stack_fffffffffffff178);
            poVar11 = std::operator<<(poVar11,local_470);
            poVar11 = std::operator<<(poVar11,'\t');
            std::
            vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
            operator[](&local_408,local_410);
            std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )0x10ad08);
            rcg::Device::getDisplayName_abi_cxx11_(in_stack_fffffffffffff198);
            poVar11 = std::operator<<(poVar11,local_490);
            std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string(local_490);
            std::__cxx11::string::~string(local_470);
            std::__cxx11::string::~string((string *)&stack0xfffffffffffffbb0);
            std::__cxx11::string::~string(local_430);
          }
          pcVar13 = local_3f0;
          std::
          vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
          ::operator[](&local_3e8,(size_type)local_3f0);
          iVar3 = (int)pcVar13;
          peVar5 = std::
                   __shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x10aed9);
          rcg::Interface::close(peVar5,iVar3);
          std::vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
          ::~vector((vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                     *)in_stack_fffffffffffff160);
        }
        pcVar13 = local_3d0;
        std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
        operator[](&local_3c8,(size_type)local_3d0);
        iVar3 = (int)pcVar13;
        peVar4 = std::__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x10af35);
        rcg::System::close(peVar4,iVar3);
        std::
        vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>::
        ~vector((vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                 *)in_stack_fffffffffffff160);
      }
      std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
      ~vector((vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
               *)in_stack_fffffffffffff160);
    }
    else {
      pcVar13 = (char *)local_10[1];
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,pcVar13,&local_c1);
      bVar2 = std::operator==(in_stack_fffffffffffff150,(char *)in_stack_fffffffffffff148);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      local_9c = bVar2;
      rcg::System::getSystems();
      for (local_e8 = (char *)0x0; pcVar13 = local_e8,
          pcVar14 = (char *)std::
                            vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                            ::size(&local_e0), pcVar13 < pcVar14; local_e8 = local_e8 + 1) {
        pcVar13 = local_e8;
        std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
        operator[](&local_e0,(size_type)local_e8);
        peVar4 = std::__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1094b1);
        rcg::System::open(peVar4,pcVar13,__oflag);
        poVar11 = std::operator<<((ostream *)&std::cout,"Transport Layer ");
        std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
        operator[](&local_e0,(size_type)local_e8);
        std::__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1094f5);
        rcg::System::getID_abi_cxx11_((System *)in_stack_fffffffffffff178);
        poVar11 = std::operator<<(poVar11,local_108);
        std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_108);
        poVar11 = std::operator<<((ostream *)&std::cout,"Vendor:         ");
        std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
        operator[](&local_e0,(size_type)local_e8);
        std::__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x109583);
        rcg::System::getVendor_abi_cxx11_((System *)in_stack_fffffffffffff178);
        poVar11 = std::operator<<(poVar11,local_128);
        std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_128);
        poVar11 = std::operator<<((ostream *)&std::cout,"Model:          ");
        std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
        operator[](&local_e0,(size_type)local_e8);
        std::__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x109611);
        rcg::System::getModel_abi_cxx11_((System *)in_stack_fffffffffffff178);
        poVar11 = std::operator<<(poVar11,local_148);
        std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_148);
        poVar11 = std::operator<<((ostream *)&std::cout,"Vendor version: ");
        std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
        operator[](&local_e0,(size_type)local_e8);
        std::__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x10969f);
        rcg::System::getVersion_abi_cxx11_((System *)in_stack_fffffffffffff178);
        poVar11 = std::operator<<(poVar11,local_168);
        std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_168);
        poVar11 = std::operator<<((ostream *)&std::cout,"TL type:        ");
        std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
        operator[](&local_e0,(size_type)local_e8);
        std::__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x10972d);
        rcg::System::getTLType_abi_cxx11_((System *)in_stack_fffffffffffff178);
        poVar11 = std::operator<<(poVar11,local_188);
        std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_188);
        poVar11 = std::operator<<((ostream *)&std::cout,"Name:           ");
        std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
        operator[](&local_e0,(size_type)local_e8);
        std::__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1097bb);
        rcg::System::getName_abi_cxx11_((System *)in_stack_fffffffffffff178);
        poVar11 = std::operator<<(poVar11,local_1a8);
        std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_1a8);
        poVar11 = std::operator<<((ostream *)&std::cout,"Pathname:       ");
        std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
        operator[](&local_e0,(size_type)local_e8);
        std::__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x109849);
        rcg::System::getPathname_abi_cxx11_((System *)in_stack_fffffffffffff178);
        poVar11 = std::operator<<(poVar11,local_1c8);
        std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_1c8);
        poVar11 = std::operator<<((ostream *)&std::cout,"Display name:   ");
        std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
        operator[](&local_e0,(size_type)local_e8);
        std::__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1098d7);
        rcg::System::getDisplayName_abi_cxx11_((System *)in_stack_fffffffffffff178);
        poVar11 = std::operator<<(poVar11,local_1e8);
        std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_1e8);
        poVar11 = std::operator<<((ostream *)&std::cout,"GenTL version   ");
        std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
        operator[](&local_e0,(size_type)local_e8);
        std::__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x109965);
        iVar3 = rcg::System::getMajorVersion(in_stack_fffffffffffff180);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar3);
        poVar11 = std::operator<<(poVar11,".");
        std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
        operator[](&local_e0,(size_type)local_e8);
        std::__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1099cf);
        iVar3 = rcg::System::getMinorVersion(in_stack_fffffffffffff180);
        pvVar8 = (void *)std::ostream::operator<<(poVar11,iVar3);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
        operator[](&local_e0,(size_type)local_e8);
        std::__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x109a46);
        rcg::System::getInterfaces(in_stack_fffffffffffff3f8);
        if ((local_9c & 1) != 0) {
          std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
          ::operator[](&local_e0,(size_type)local_e8);
          std::__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x109a83);
          rcg::System::getNodeMap((System *)in_stack_fffffffffffff1e8);
          rcg::printNodemap(in_stack_fffffffffffff200,(char *)in_stack_fffffffffffff1f8,
                            in_stack_fffffffffffff1f4,
                            SUB41((uint)in_stack_fffffffffffff1f0 >> 0x18,0));
          std::shared_ptr<GenApi_3_4::CNodeMapRef>::~shared_ptr
                    ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x109ac2);
          std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        }
        for (local_218 = (char *)0x0; pcVar13 = local_218,
            pcVar14 = (char *)std::
                              vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                              ::size(&local_200), pcVar13 < pcVar14; local_218 = local_218 + 1) {
          pcVar13 = local_218;
          std::
          vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
          ::operator[](&local_200,(size_type)local_218);
          peVar5 = std::
                   __shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x109e31);
          rcg::Interface::open(peVar5,pcVar13,__oflag_00);
          poVar11 = std::operator<<((ostream *)&std::cout,"    Interface     ");
          std::
          vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
          ::operator[](&local_200,(size_type)local_218);
          peVar5 = std::
                   __shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x109e75);
          psVar9 = rcg::Interface::getID_abi_cxx11_(peVar5);
          poVar11 = std::operator<<(poVar11,(string *)psVar9);
          std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
          poVar11 = std::operator<<((ostream *)&std::cout,"    Display name: ");
          std::
          vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
          ::operator[](&local_200,(size_type)local_218);
          std::__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x109ef6);
          rcg::Interface::getDisplayName_abi_cxx11_((Interface *)in_stack_fffffffffffff178);
          poVar11 = std::operator<<(poVar11,local_238);
          std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_238);
          poVar11 = std::operator<<((ostream *)&std::cout,"    TL type:      ");
          std::
          vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
          ::operator[](&local_200,(size_type)local_218);
          std::__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x109f84);
          rcg::Interface::getTLType_abi_cxx11_((Interface *)in_stack_fffffffffffff178);
          poVar11 = std::operator<<(poVar11,local_258);
          std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_258);
          std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          std::
          vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
          ::operator[](&local_200,(size_type)local_218);
          std::__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x10a00a);
          rcg::Interface::getDevices(in_stack_fffffffffffff148);
          if ((local_9c & 1) != 0) {
            std::
            vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
            ::operator[](&local_200,(size_type)local_218);
            std::__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x10a047);
            rcg::Interface::getNodeMap(in_stack_fffffffffffff1e8);
            rcg::printNodemap(in_stack_fffffffffffff200,(char *)in_stack_fffffffffffff1f8,
                              in_stack_fffffffffffff1f4,
                              SUB41((uint)in_stack_fffffffffffff1f0 >> 0x18,0));
            std::shared_ptr<GenApi_3_4::CNodeMapRef>::~shared_ptr
                      ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x10a086);
            std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          }
          for (local_288 = 0; uVar1 = local_288,
              sVar7 = std::
                      vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                      ::size(&local_270), uVar1 < sVar7; local_288 = local_288 + 1) {
            poVar11 = std::operator<<((ostream *)&std::cout,"        Device             ");
            std::
            vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
            operator[](&local_270,local_288);
            peVar6 = std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x10a1a2);
            psVar9 = rcg::Device::getID_abi_cxx11_(peVar6);
            poVar11 = std::operator<<(poVar11,(string *)psVar9);
            std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
            poVar11 = std::operator<<((ostream *)&std::cout,"        Vendor:            ");
            std::
            vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
            operator[](&local_270,local_288);
            std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )0x10a223);
            rcg::Device::getVendor_abi_cxx11_(in_stack_fffffffffffff178);
            poVar11 = std::operator<<(poVar11,local_2a8);
            std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string(local_2a8);
            poVar11 = std::operator<<((ostream *)&std::cout,"        Model:             ");
            std::
            vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
            operator[](&local_270,local_288);
            std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )0x10a2b1);
            rcg::Device::getModel_abi_cxx11_(in_stack_fffffffffffff178);
            poVar11 = std::operator<<(poVar11,local_2c8);
            std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string(local_2c8);
            poVar11 = std::operator<<((ostream *)&std::cout,"        TL type:           ");
            std::
            vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
            operator[](&local_270,local_288);
            std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )0x10a33f);
            rcg::Device::getTLType_abi_cxx11_(in_stack_fffffffffffff178);
            poVar11 = std::operator<<(poVar11,local_2e8);
            std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string(local_2e8);
            poVar11 = std::operator<<((ostream *)&std::cout,"        Display name:      ");
            std::
            vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
            operator[](&local_270,local_288);
            std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )0x10a3cd);
            rcg::Device::getDisplayName_abi_cxx11_(in_stack_fffffffffffff198);
            poVar11 = std::operator<<(poVar11,local_308);
            std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string(local_308);
            poVar11 = std::operator<<((ostream *)&std::cout,"        User defined name: ");
            std::
            vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
            operator[](&local_270,local_288);
            std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )0x10a45b);
            rcg::Device::getUserDefinedName_abi_cxx11_(in_stack_fffffffffffff288);
            poVar11 = std::operator<<(poVar11,local_328);
            std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string(local_328);
            poVar11 = std::operator<<((ostream *)&std::cout,"        Access status:     ");
            std::
            vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
            operator[](&local_270,local_288);
            std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )0x10a4e9);
            rcg::Device::getAccessStatus_abi_cxx11_(in_stack_fffffffffffff1d8);
            poVar11 = std::operator<<(poVar11,local_348);
            std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string(local_348);
            poVar11 = std::operator<<((ostream *)&std::cout,"        Serial number:     ");
            std::
            vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
            operator[](&local_270,local_288);
            std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )0x10a577);
            rcg::Device::getSerialNumber_abi_cxx11_(in_stack_fffffffffffff178);
            poVar11 = std::operator<<(poVar11,local_368);
            std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string(local_368);
            poVar11 = std::operator<<((ostream *)&std::cout,"        Version:           ");
            std::
            vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
            operator[](&local_270,local_288);
            std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )0x10a605);
            rcg::Device::getVersion_abi_cxx11_(in_stack_fffffffffffff178);
            poVar11 = std::operator<<(poVar11,local_388);
            std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string(local_388);
            poVar11 = std::operator<<((ostream *)&std::cout,"        TS Frequency:      ");
            std::
            vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>::
            operator[](&local_270,local_288);
            std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )0x10a693);
            uVar10 = rcg::Device::getTimestampFrequency(in_stack_fffffffffffff1b0);
            pvVar8 = (void *)std::ostream::operator<<(poVar11,uVar10);
            std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
            std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          }
          pcVar13 = local_218;
          std::
          vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
          ::operator[](&local_200,(size_type)local_218);
          iVar3 = (int)pcVar13;
          peVar5 = std::
                   __shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x10a851);
          rcg::Interface::close(peVar5,iVar3);
          std::vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
          ::~vector((vector<std::shared_ptr<rcg::Device>,_std::allocator<std::shared_ptr<rcg::Device>_>_>
                     *)in_stack_fffffffffffff160);
        }
        pcVar13 = local_e8;
        std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
        operator[](&local_e0,(size_type)local_e8);
        iVar3 = (int)pcVar13;
        peVar4 = std::__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x10a8ad);
        rcg::System::close(peVar4,iVar3);
        std::
        vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>::
        ~vector((vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                 *)in_stack_fffffffffffff160);
      }
      std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
      ~vector((vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
               *)in_stack_fffffffffffff160);
    }
  }
LAB_0010cd78:
  rcg::System::clearSystems();
  return local_14;
}

Assistant:

int main(int argc, char *argv[])
{
  int ret=0;

  try
  {
    if (argc >= 2 && std::string(argv[1]) != "-h")
    {
      if (std::string(argv[1]) == "-L" || std::string(argv[1]) == "-l")
      {
        bool extended=(std::string(argv[1]) == "-L");

        // list all systems, interfaces and devices

        std::vector<std::shared_ptr<rcg::System> > system=rcg::System::getSystems();

        for (size_t i=0; i<system.size(); i++)
        {
          system[i]->open();

          std::cout << "Transport Layer " << system[i]->getID() << std::endl;
          std::cout << "Vendor:         " << system[i]->getVendor() << std::endl;
          std::cout << "Model:          " << system[i]->getModel() << std::endl;
          std::cout << "Vendor version: " << system[i]->getVersion() << std::endl;
          std::cout << "TL type:        " << system[i]->getTLType() << std::endl;
          std::cout << "Name:           " << system[i]->getName() << std::endl;
          std::cout << "Pathname:       " << system[i]->getPathname() << std::endl;
          std::cout << "Display name:   " << system[i]->getDisplayName() << std::endl;
          std::cout << "GenTL version   " << system[i]->getMajorVersion() << "."
                    << system[i]->getMinorVersion() << std::endl;
          std::cout << std::endl;

          std::vector<std::shared_ptr<rcg::Interface> > interf=system[i]->getInterfaces();

          if (extended)
          {
            rcg::printNodemap(system[i]->getNodeMap(), "Root");
            std::cout << std::endl;
          }

          for (size_t k=0; k<interf.size(); k++)
          {
            interf[k]->open();

            std::cout << "    Interface     " << interf[k]->getID() << std::endl;
            std::cout << "    Display name: " << interf[k]->getDisplayName() << std::endl;
            std::cout << "    TL type:      " << interf[k]->getTLType() << std::endl;
            std::cout << std::endl;

            std::vector<std::shared_ptr<rcg::Device> > device=interf[k]->getDevices();

            if (extended)
            {
              rcg::printNodemap(interf[k]->getNodeMap(), "Root");
              std::cout << std::endl;
            }

            for (size_t j=0; j<device.size(); j++)
            {
              std::cout << "        Device             " << device[j]->getID() << std::endl;
              std::cout << "        Vendor:            " << device[j]->getVendor() << std::endl;
              std::cout << "        Model:             " << device[j]->getModel() << std::endl;
              std::cout << "        TL type:           " << device[j]->getTLType() << std::endl;
              std::cout << "        Display name:      " << device[j]->getDisplayName() << std::endl;
              std::cout << "        User defined name: " << device[j]->getUserDefinedName() << std::endl;
              std::cout << "        Access status:     " << device[j]->getAccessStatus() << std::endl;
              std::cout << "        Serial number:     " << device[j]->getSerialNumber() << std::endl;
              std::cout << "        Version:           " << device[j]->getVersion() << std::endl;
              std::cout << "        TS Frequency:      " << device[j]->getTimestampFrequency() << std::endl;
              std::cout << std::endl;
            }

            interf[k]->close();
          }

          system[i]->close();
        }
      }
      else if (std::string(argv[1]) == "-s")
      {
        // list all systems, interfaces and devices

        std::vector<std::shared_ptr<rcg::System> > system=rcg::System::getSystems();

        std::cout << "Interface\tSerial Number\tVendor\tModel\tName" << std::endl;

        for (size_t i=0; i<system.size(); i++)
        {
          system[i]->open();

          std::vector<std::shared_ptr<rcg::Interface> > interf=system[i]->getInterfaces();

          for (size_t k=0; k<interf.size(); k++)
          {
            interf[k]->open();

            std::vector<std::shared_ptr<rcg::Device> > device=interf[k]->getDevices();

            for (size_t j=0; j<device.size(); j++)
            {
              std::cout << interf[k]->getID() << '\t'
                        << device[j]->getSerialNumber() << '\t'
                        << device[j]->getVendor() << '\t'
                        << device[j]->getModel() << '\t'
                        << device[j]->getDisplayName() << std::endl;
            }

            interf[k]->close();
          }

          system[i]->close();
        }
      }
      else
      {
        int k=1;

        // get parameters, if any

        int module_event_timeout=-1;
        const char *xml=0;
        const char *paramfile=0;
        bool local_nodemap=false;
        bool edit=false;

        while (k+1 < argc && argv[k][0] == '-')
        {
          if (std::string(argv[k]) == "-o")
          {
            k++;
            xml=argv[k++];

            if (std::string(xml) == ".")
            {
              xml="";
            }
          }
          else if (std::string(argv[k]) == "-m")
          {
            k++;
            module_event_timeout=std::stoi(std::string(argv[k++]));
          }
          else if (std::string(argv[k]) == "-p")
          {
            k++;
            paramfile=argv[k++];
          }
          else if (std::string(argv[k]) == "-d")
          {
            k++;
            local_nodemap=true;
          }
          else if (std::string(argv[k]) == "-e")
          {
            k++;
            edit=true;
          }
          else
          {
            std::cerr << "Unknown parameter: " << argv[k] << std::endl;
            ret=1;
            break;
          }
        }

        if (ret == 0)
        {
          if (k < argc)
          {
            // separate optional node name from device id

            std::string devid=argv[k++];
            std::string node="Root";
            int depth=1000;

            {
              size_t j=devid.find('?');

              if (j != std::string::npos)
              {
                if (devid.substr(j+1) != "-")
                {
                  node=devid.substr(j+1);
                  devid=devid.substr(0, j);
                  depth=1;

                  if (node.size() == 0)
                  {
                    node="Root";
                  }
                }
                else
                {
                  node="";
                  devid=devid.substr(0, j);
                }
              }
            }

            // find specific device accross all systems and interfaces

            std::shared_ptr<rcg::Device> dev=rcg::getDevice(devid.c_str());

            if (dev)
            {
              // open device and optionally change some settings

              if (k < argc || edit || paramfile)
              {
                dev->open(rcg::Device::CONTROL);
              }
              else
              {
                dev->open(rcg::Device::READONLY);
              }

              // get nodemap

              std::shared_ptr<GenApi::CNodeMapRef> nodemap;
              if (local_nodemap)
              {
                nodemap=dev->getNodeMap(xml);
              }
              else
              {
                nodemap=dev->getRemoteNodeMap(xml);
              }

              // register and enable module events

              if (module_event_timeout >= 0)
              {
                dev->enableModuleEvents();

                std::shared_ptr<GenApi::CNodeMapRef> lnodemap;
                lnodemap=dev->getNodeMap();

                std::vector<std::string> list;
                rcg::getEnum(lnodemap, "EventSelector", list, false);

                for (size_t i=0; i<list.size(); i++)
                {
                  rcg::setEnum(lnodemap, "EventSelector", list[i].c_str(), true);
                  rcg::setEnum(lnodemap, "EventNotification", "On", false);
                }
              }

              if (nodemap)
              {
                // interpret all remaining parameters

                while (k < argc)
                {
                  std::string p=argv[k++];

                  if (p.size() > 0 && p[0] == '@')
                  {
                    // load streamable parameters from file into nodemap

                    rcg::loadStreamableParameters(nodemap, p.substr(1).c_str(), true);
                  }
                  else if (p.find('=') != std::string::npos)
                  {
                    // split argument in key and value

                    size_t j=p.find('=');
                    std::string value=p.substr(j+1);
                    std::string key=p.substr(0, j);

                    // set key=value pair through GenICam

                    rcg::setString(nodemap, key.c_str(), value.c_str(), true);
                  }
                  else
                  {
                    // call the command
                    rcg::callCommand(nodemap, p.c_str(), true);
                  }
                }

                if (module_event_timeout >= 0)
                {
                  std::cout << "Waiting for events" << std::endl;

                  int64_t eventid=dev->getModuleEvent(1000*module_event_timeout);

                  if (eventid < 0)
                  {
                    std::cout << "Received no module events" << std::endl;
                  }

                  while (eventid >= 0)
                  {
                    std::cout << "Received module event with ID: " << eventid << std::endl;
                    eventid=dev->getModuleEvent(0);
                  }

                  std::cout << std::endl;
                }

                if (edit)
                {
                  if (!rcg::editNodemap(nodemap, node.c_str()))
                  {
                    std::cerr << "Unknown node: " << node << std::endl;
                    ret=1;
                  }
                }
                else if (node.size() > 0)
                {
                  if (depth > 1)
                  {
                    // report all features

                    std::cout << "Device:            " << dev->getID() << std::endl;
                    std::cout << "Vendor:            " << dev->getVendor() << std::endl;
                    std::cout << "Model:             " << dev->getModel() << std::endl;
                    std::cout << "TL type:           " << dev->getTLType() << std::endl;
                    std::cout << "Display name:      " << dev->getDisplayName() << std::endl;
                    std::cout << "User defined name: " << dev->getUserDefinedName() << std::endl;
                    std::cout << "Serial number:     " << dev->getSerialNumber() << std::endl;
                    std::cout << "Version:           " << dev->getVersion() << std::endl;
                    std::cout << "TS Frequency:      " << dev->getTimestampFrequency() << std::endl;
                    std::cout << std::endl;

                    std::vector<std::shared_ptr<rcg::Stream> > stream=dev->getStreams();

                    std::cout << "Available streams:" << std::endl;
                    for (size_t i=0; i<stream.size(); i++)
                    {
                      std::cout << "  Stream ID: " << stream[i]->getID() << std::endl;
                    }

                    std::cout << std::endl;

                    if (local_nodemap)
                    {
                      std::cout << "Local device nodemap:" << std::endl;
                    }
                    else
                    {
                      std::cout << "Remote device nodemap:" << std::endl;
                    }

                    rcg::printNodemap(nodemap, node.c_str(), depth, true);
                  }
                  else
                  {
                    // report requested node only

                    if (!rcg::printNodemap(nodemap, node.c_str(), depth, true))
                    {
                      std::cerr << "Unknown node: " << node << std::endl;
                      ret=1;
                    }
                  }
                }

                if (paramfile)
                {
                  rcg::saveStreamableParameters(nodemap, paramfile, true);
                }
              }
              else
              {
                std::cerr << "Nodemap not available!" << std::endl;
              }

              dev->close();
            }
            else
            {
              std::cerr << "Device '" << devid << "' not found!" << std::endl;
              ret=1;
            }
          }
          else
          {
            std::cerr << "Device name not given!" << std::endl;
            ret=1;
          }
        }
      }
    }
    else
    {
      std::cout << argv[0] << " -h | -L | -l | -s | ([-o <xml-output-file>|.] [-m <timeout>] [-p <file>] [-d] [-e] [<interface-id>:]<device-id>[?<node>] [@<file>] [<key>=<value>] ...)" << std::endl;
      std::cout << std::endl;
      std::cout << "Provides information about GenICam transport layers, interfaces and devices." << std::endl;
      std::cout << std::endl;
      std::cout << "Options: " << std::endl;
      std::cout << "-h   Prints help information and exits" << std::endl;
      std::cout << "-L   List all available devices on all interfaces (extended format)" << std::endl;
      std::cout << "-l   List all available devices on all interfaces" << std::endl;
      std::cout << "-s   List all available devices on all interfaces (short format)" << std::endl;
      std::cout << "-o   Store XML description from specified device" << std::endl;
      std::cout << "-m   Registers for module events and waits for the given number of seconds for such events" << std::endl;
      std::cout << "-d   Use local device nodemap, instead of remote nodemap" << std::endl;
      std::cout << "-e   Open nodemap editor instead of printing nodemap" << std::endl;
      std::cout << "-p   Store all streamable parameters to the given file, after applying all parameters" << std::endl;
      std::cout << std::endl;
      std::cout << "Parameters:" << std::endl;
      std::cout << "<interface-id> Optional GenICam ID of interface for connecting to the device" << std::endl;
      std::cout << "<device-id>    GenICam device ID, serial number or user defined name of device" << std::endl;
      std::cout << "<node>         Optional name of category or parameter to be reported. '-' for none. Default is 'Root'." << std::endl;
      std::cout << "@<file>        Optional file with parameters as store with parameter '-p'" << std::endl;
      std::cout << "<key>=<value>  Optional GenICam parameters to be changed in the given order before reporting" << std::endl;
      ret=1;
    }
  }
  catch (const std::exception &ex)
  {
    std::cerr << ex.what() << std::endl;
    ret=2;
  }

  rcg::System::clearSystems();

  return ret;
}